

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

iterator __thiscall cs::tree_type<cs::token_base_*>::iterator::left(iterator *this)

{
  error *this_00;
  allocator local_31;
  string local_30;
  
  if (this->mData != (tree_node *)0x0) {
    return (iterator)this->mData->left;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_30,"E000E",&local_31);
  cov::error::error(this_00,&local_30);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

bool usable() const noexcept
			{
				return this->mData != nullptr;
			}